

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_geometry.cpp
# Opt level: O3

bool __thiscall ON_Geometry::SwapCoordinates(ON_Geometry *this,int i,int j)

{
  undefined1 uVar1;
  int iVar2;
  double *pdVar3;
  long lVar4;
  ulong uVar5;
  ON_Xform *pOVar6;
  ON_Xform *pOVar7;
  ulong uVar8;
  byte bVar9;
  ON_Xform swapij;
  ON_Xform local_b0;
  
  bVar9 = 0;
  iVar2 = (*(this->super_ON_Object)._vptr_ON_Object[0x18])();
  uVar1 = 0;
  if (((((uint)j < 3) && ((uint)i < 3)) && (uVar1 = 0, iVar2 - 1U < 3)) && (uVar1 = 1, i != j)) {
    pOVar6 = &ON_Xform::ZeroTransformation;
    pOVar7 = &local_b0;
    for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
      pOVar7->m_xform[0][0] = pOVar6->m_xform[0][0];
      pOVar6 = (ON_Xform *)((long)pOVar6 + ((ulong)bVar9 * -2 + 1) * 8);
      pOVar7 = (ON_Xform *)((long)pOVar7 + ((ulong)bVar9 * -2 + 1) * 8);
    }
    uVar8 = 0;
    do {
      uVar5 = uVar8;
      iVar2 = (int)uVar8;
      if ((uint)j == uVar8) {
        uVar5 = (ulong)(uint)i;
        iVar2 = j;
      }
      if ((uint)i == uVar8) {
        uVar5 = (ulong)(uint)j;
        iVar2 = i;
      }
      pdVar3 = ON_Xform::operator[](&local_b0,iVar2);
      pdVar3[uVar5] = 1.0;
      uVar8 = uVar8 + 1;
    } while (uVar8 != 4);
    iVar2 = (*(this->super_ON_Object)._vptr_ON_Object[0x1c])(this,&local_b0);
    uVar1 = (undefined1)iVar2;
  }
  return (bool)uVar1;
}

Assistant:

bool ON_Geometry::SwapCoordinates(
      int i, int j        // indices of coords to swap
      )
{
  bool rc = false;
  const int dim = Dimension();
  if ( dim > 0 && dim <= 3 && i >= 0 && i < 3 && j >= 0 && j < 3 ) {
    if ( i == j ) {
      rc = true;
    }
    else {
      int k;
      ON_Xform swapij(ON_Xform::ZeroTransformation);
      for ( k = 0; k < 4; k++ ) {
        if ( i == k )
          swapij[k][j] = 1.0;
        else if ( j == k )
          swapij[k][i] = 1.0;
        else
          swapij[k][k] = 1.0;
      }
      rc = Transform( swapij );
    }
  }
  return rc;
}